

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NavUpdateInitResult(void)

{
  ImGuiContext *pIVar1;
  ImVec2 *pIVar2;
  ImGuiContext *g;
  ImGuiID in_stack_0000000c;
  int in_stack_00000010;
  ImGuiID in_stack_00000014;
  
  pIVar1 = GImGui;
  if (GImGui->NavWindow != (ImGuiWindow *)0x0) {
    if ((GImGui->NavInitRequestFromMove & 1U) == 0) {
      SetNavID(GImGui->NavInitResultId,GImGui->NavLayer,0);
    }
    else {
      SetNavIDWithRectRel(in_stack_00000014,in_stack_00000010,in_stack_0000000c,(ImRect *)g);
    }
    pIVar2 = &pIVar1->NavWindow->NavRectRel[pIVar1->NavLayer].Min;
    *pIVar2 = (pIVar1->NavInitResultRectRel).Min;
    pIVar2[1] = (pIVar1->NavInitResultRectRel).Max;
  }
  return;
}

Assistant:

static void ImGui::NavUpdateInitResult()
{
    // In very rare cases g.NavWindow may be null (e.g. clearing focus after requesting an init request, which does happen when releasing Alt while clicking on void)
    ImGuiContext& g = *GImGui;
    if (!g.NavWindow)
        return;

    // Apply result from previous navigation init request (will typically select the first item, unless SetItemDefaultFocus() has been called)
    IMGUI_DEBUG_LOG_NAV("[nav] NavInitRequest: result NavID 0x%08X in Layer %d Window \"%s\"\n", g.NavInitResultId, g.NavLayer, g.NavWindow->Name);
    if (g.NavInitRequestFromMove)
        SetNavIDWithRectRel(g.NavInitResultId, g.NavLayer, 0, g.NavInitResultRectRel);
    else
        SetNavID(g.NavInitResultId, g.NavLayer, 0);
    g.NavWindow->NavRectRel[g.NavLayer] = g.NavInitResultRectRel;
}